

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVector.h
# Opt level: O2

void __thiscall
SimpleVector<MiniScript::InputBufferEntry>::insert
          (SimpleVector<MiniScript::InputBufferEntry> *this,InputBufferEntry *item,long idx)

{
  ulong uVar1;
  InputBufferEntry *pIVar2;
  InputBufferEntry *pIVar3;
  ulong uVar4;
  InputBufferEntry *pIVar5;
  
  if ((-1 < idx) && (uVar4 = this->mQtyItems, idx <= (long)uVar4)) {
    while (uVar1 = this->mBufItems, uVar1 <= uVar4) {
      uVar4 = this->mBlockItems;
      if (this->mBlockItems == 0) {
        uVar4 = uVar1;
      }
      if (uVar4 < 0x11) {
        uVar4 = 0x10;
      }
      resizeBuffer(this,uVar4 + uVar1);
      uVar4 = this->mQtyItems;
    }
    if (idx < (long)uVar4) {
      pIVar2 = this->mBuf;
      pIVar3 = pIVar2 + uVar4;
      while (pIVar5 = pIVar3 + -1, pIVar2 + idx <= pIVar5) {
        *pIVar3 = *pIVar5;
        pIVar3 = pIVar5;
      }
    }
    this->mBuf[idx] = *item;
    this->mQtyItems = this->mQtyItems + 1;
    return;
  }
  MiniScript::_Error("invalid index in SimpleVector::insert",
                     "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                     ,0x124);
  return;
}

Assistant:

inline void SimpleVector<T>::insert(const T& item, const long idx)
{
	if (idx < 0 or idx > (long)mQtyItems) {
		#if USE_EXCEPTIONS
			throw memFullErr;
		#else
			Error("invalid index in SimpleVector::insert");;
		#endif
		return;
	}

	// resize the buffer if needed
	while (mQtyItems >= mBufItems) {
		// yes -- expand it by one block (should never need more than that!),
		// or by double the size
		unsigned long expandBy = (mBlockItems > 0 ? mBlockItems : mBufItems);
		if (expandBy < 16) expandBy = 16;
		resizeBuffer( mBufItems + expandBy );
	}
	
	// move all items past idx
	if (idx < (long)mQtyItems) {
		T* src = &mBuf[mQtyItems-1];
		T* dest = &mBuf[mQtyItems];
		T* end = &mBuf[idx];
		while (src >= end) {
			*dest-- = *src--;
		}
	}
	
	// finally, stuff the item
	mBuf[idx] = item;
	mQtyItems++;	
}